

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::PresolveNames(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *this)

{
  size_type sVar1;
  ValuePresolver *this_00;
  ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
  *this_01;
  ObjList *this_02;
  reference this_03;
  __normal_iterator<const_mp::pre::VCString_*,_std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>_>
  in_RDI;
  size_type i;
  ObjList *obj;
  vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *ocs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *vcs;
  MVOverEl<VCString> vm;
  SOS_1or2_Constraint<2> *in_stack_fffffffffffffbc8;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffbd0;
  ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
  *this_04;
  ValuePresolverImpl *in_stack_fffffffffffffbe0;
  ConstraintManager *this_05;
  ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>
  *in_stack_fffffffffffffbe8;
  ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>
  *in_stack_fffffffffffffbf0;
  ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int> *v;
  __normal_iterator<const_mp::pre::VCString_*,_std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>_>
  in_stack_fffffffffffffc10;
  size_type local_3d0;
  VCString *local_3b0;
  VCString *local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc68;
  ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>
  *in_stack_fffffffffffffc70;
  ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>
  *in_stack_fffffffffffffc90;
  undefined1 local_268 [304];
  ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
  local_138;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)in_RDI._M_current)->var_names_);
  if (sVar1 != 0) {
    GetValuePresolver((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)in_RDI._M_current);
    pre::ValuePresolverImpl::CleanUpNameNodes(in_stack_fffffffffffffbe0);
    v = (ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int> *)0x0;
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::TransferNames2Node<mp::SOS_1or2_Constraint<1>>
              (in_stack_fffffffffffffbd0,(SOS_1or2_Constraint<1> *)in_stack_fffffffffffffbc8);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::TransferNames2Node<mp::SOS_1or2_Constraint<2>>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    this_00 = GetValuePresolver((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)in_RDI._M_current);
    pre::ValueMap<std::vector<mp::pre::VCString,std::allocator<mp::pre::VCString>>,int>::
    ValueMap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    pre::ValueMap<std::vector<mp::pre::VCString,std::allocator<mp::pre::VCString>>,int>::
    ValueMap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    pre::ValueMap<std::vector<mp::pre::VCString,std::allocator<mp::pre::VCString>>,int>::
    ValueMap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    pre::
    ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
    ::ModelValues((ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
                   *)this_00,v,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                  in_stack_fffffffffffffbe0);
    (*(this_00->super_ValuePresolverImpl).super_BasicValuePresolver._vptr_BasicValuePresolver[0xe])
              (&local_138,this_00,local_268,0);
    pre::
    ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
    ::~ModelValues((ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
                    *)in_stack_fffffffffffffbd0);
    pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>::
    ~ValueMap((ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int> *)
              in_stack_fffffffffffffbd0);
    pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>::
    ~ValueMap((ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int> *)
              in_stack_fffffffffffffbd0);
    pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>::
    ~ValueMap((ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int> *)
              in_stack_fffffffffffffbd0);
    pre::
    ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
    ::GetVarValues(&local_138);
    pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>::
    operator()(in_stack_fffffffffffffc90);
    local_3a8 = (VCString *)
                std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::begin
                          ((vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)
                           in_stack_fffffffffffffbc8);
    local_3b0 = (VCString *)
                std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::end
                          ((vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)
                           in_stack_fffffffffffffbc8);
    this_05 = (ConstraintManager *)&stack0xfffffffffffffc4f;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x4332d4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<__gnu_cxx::__normal_iterator<mp::pre::VCString_const*,std::vector<mp::pre::VCString,std::allocator<mp::pre::VCString>>>,void>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,in_stack_fffffffffffffc10,in_RDI,(allocator_type *)v);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x433305);
    FlatModel<mp::DefaultFlatModelParams>::AddVarNames
              (&in_stack_fffffffffffffbd0->super_FlatModel<mp::DefaultFlatModelParams>,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbc8);
    pre::
    ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
    ::GetObjValues(&local_138);
    this_01 = (ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
               *)pre::
                 ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>::
                 operator()(in_stack_fffffffffffffc90);
    this_04 = this_01;
    this_02 = FlatModel<mp::DefaultFlatModelParams>::get_objectives
                        ((FlatModel<mp::DefaultFlatModelParams> *)in_RDI._M_current);
    local_3d0 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::size
                          (this_02);
    while (sVar1 = local_3d0 - 1, local_3d0 != 0) {
      this_03 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::
                operator[](this_02,sVar1);
      std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::operator[]
                ((vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)this_01,sVar1);
      pre::VCString::operator_cast_to_string((VCString *)this_03);
      LinearObjective::set_name((LinearObjective *)this_04,(string *)this_03);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc10);
      local_3d0 = sVar1;
    }
    ConstraintManager::CopyNamesFromValueNodes(this_05);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_05);
    pre::
    ModelValues<mp::pre::ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int>_>
    ::~ModelValues(this_04);
  }
  return;
}

Assistant:

void PresolveNames() {
    if (var_names_.size()) {
      /// Check that constr / obj names are present too?
      GetValuePresolver().CleanUpNameNodes();
      // They are at top level of the reformulation tree
      TransferNames2Node((SOS1Constraint*)nullptr);
      TransferNames2Node((SOS2Constraint*)nullptr);
      auto vm = GetValuePresolver().
          PresolveNames({
                          {var_names_},
                          {con_names_},
                          {obj_names_}
                        });
      const auto& vcs = vm.GetVarValues()();    // vars
      std::vector<std::string> vs(vcs.begin(), vcs.end());
      BaseFlatModel::AddVarNames(vs);
      const auto& ocs = vm.GetObjValues()();    // objs
      auto& obj = BaseFlatModel::get_objectives();
      assert(obj.size() == ocs.size());
      for (auto i=obj.size(); i--;)
        obj[i].set_name(ocs[i]);
      ConstraintManager::CopyNamesFromValueNodes();  // cons
    }
  }